

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool Trace(DVector3 *start,sector_t_conflict *sector,DVector3 *direction,double maxDist,
          ActorFlags *actorMask,DWORD wallMask,AActor *ignore,FTraceResults *res,DWORD flags,
          _func_ETraceStatus_FTraceResults_ptr_void_ptr *callback,void *callbackdata)

{
  bool bVar1;
  uint uVar2;
  TVector3<double> *pTVar3;
  bool local_5f1;
  TFlags<ActorFlag,_unsigned_int> local_5e4;
  undefined1 local_5e0 [3];
  bool reslt;
  FTraceResults tempResult;
  FTraceInfo inf;
  AActor *ignore_local;
  DWORD wallMask_local;
  ActorFlags *actorMask_local;
  double maxDist_local;
  DVector3 *direction_local;
  sector_t_conflict *sector_local;
  DVector3 *start_local;
  
  inf._1216_8_ = ignore;
  direction_local = (DVector3 *)sector;
  sector_local = (sector_t_conflict *)start;
  FTraceInfo::FTraceInfo((FTraceInfo *)&tempResult.Crossed3DWaterPos.Z);
  FTraceResults::FTraceResults((FTraceResults *)local_5e0);
  memset(local_5e0,0,0xd0);
  tempResult.SrcAngleFromTarget.Degrees = 3.4028234663852886e+38;
  tempResult.Distance = 3.4028234663852886e+38;
  TVector3<double>::operator=
            ((TVector3<double> *)&tempResult.Crossed3DWaterPos.Z,(TVector3<double> *)sector_local);
  GetPortalTransition((DVector3 *)&tempResult.Crossed3DWaterPos.Z,
                      (sector_t_conflict **)&direction_local);
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)actorMask);
  inf.limitz._0_4_ = 1;
  if (uVar2 != 0) {
    inf.limitz._0_4_ = 7;
  }
  TVector3<double>::operator=((TVector3<double> *)&inf.Start.Z,direction);
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_5e4,actorMask);
  TFlags<ActorFlag,_unsigned_int>::operator=
            ((TFlags<ActorFlag,_unsigned_int> *)&inf.Vec.Z,&local_5e4);
  inf.ActorMask.Value = inf.sectorsel;
  inf.WallMask = inf._1220_4_;
  inf.Results = (FTraceResults *)direction_local;
  inf.MaxDist = 0.0;
  inf.EnterDist = (double)callback;
  inf.TraceCallback = (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)callbackdata;
  inf.TraceCallbackData._0_4_ = flags;
  inf.IgnoreThis = (AActor *)res;
  inf.TraceCallbackData._4_4_ = 1;
  inf.DummySector[1].e._0_4_ = 0;
  inf.TraceFlags = 0;
  inf.inshootthrough = 0;
  inf.startfrac = inf.Start.Y;
  inf.Vec.Z._4_4_ = wallMask;
  inf.CurSector = (sector_t_conflict *)maxDist;
  memset(res,0,0xd0);
  if (((flags & 0x10) != 0) && (callback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    tempResult.Line._4_4_ = 5;
    pTVar3 = TVector3<double>::operator=
                       ((TVector3<double> *)&tempResult.HitVector.Z,
                        (TVector3<double> *)&tempResult.Crossed3DWaterPos.Z);
    TVector3<double>::operator=((TVector3<double> *)&tempResult.HitTexture,pTVar3);
    TVector3<double>::operator=
              ((TVector3<double> *)&tempResult.HitPos.Z,(TVector3<double> *)&inf.Start.Z);
    (*callback)((FTraceResults *)local_5e0,inf.TraceCallback);
  }
  bVar1 = FTraceInfo::TraceTraverse((FTraceInfo *)&tempResult.Crossed3DWaterPos.Z,inf.limitz._0_4_);
  if (((flags & 0x10) != 0) && (callback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    tempResult.Line._4_4_ = 5;
    pTVar3 = TVector3<double>::operator=
                       ((TVector3<double> *)&tempResult.HitVector.Z,
                        (TVector3<double> *)
                        &((inf.IgnoreThis)->super_DThinker).super_DObject.ObjNext);
    TVector3<double>::operator=((TVector3<double> *)&tempResult.HitTexture,pTVar3);
    TVector3<double>::operator=
              ((TVector3<double> *)&tempResult.HitPos.Z,(TVector3<double> *)&inf.Start.Z);
    (*callback)((FTraceResults *)local_5e0,inf.TraceCallback);
  }
  if (bVar1) {
    if (flags == 0) {
      local_5f1 = true;
    }
    else {
      local_5f1 = EditTraceResult(flags,res);
    }
    start_local._7_1_ = local_5f1;
  }
  else {
    start_local._7_1_ = false;
  }
  return start_local._7_1_;
}

Assistant:

bool Trace(const DVector3 &start, sector_t *sector, const DVector3 &direction, double maxDist,
	ActorFlags actorMask, DWORD wallMask, AActor *ignore, FTraceResults &res, DWORD flags,
	ETraceStatus(*callback)(FTraceResults &res, void *), void *callbackdata)
{
	FTraceInfo inf;
	FTraceResults tempResult;

	memset(&tempResult, 0, sizeof(tempResult));
	tempResult.Fraction = tempResult.Distance = NO_VALUE;

	inf.Start = start;
	GetPortalTransition(inf.Start, sector);
	inf.ptflags = actorMask ? PT_ADDLINES|PT_ADDTHINGS|PT_COMPATIBLE : PT_ADDLINES;
	inf.Vec = direction;
	inf.ActorMask = actorMask;
	inf.WallMask = wallMask;
	inf.IgnoreThis = ignore;
	inf.CurSector = sector;
	inf.MaxDist = maxDist;
	inf.EnterDist = 0;
	inf.TraceCallback = callback;
	inf.TraceCallbackData = callbackdata;
	inf.TraceFlags = flags;
	inf.Results = &res;
	inf.inshootthrough = true;
	inf.sectorsel=0;
	inf.startfrac = 0;
	inf.limitz = inf.Start.Z;
	memset(&res, 0, sizeof(res));

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Start;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}
	bool reslt = inf.TraceTraverse(inf.ptflags);

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Results->HitPos;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}

	if (reslt)
	{ 
		return flags ? EditTraceResult(flags, res) : true;
	}
	else
	{
		return false;
	}
}